

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultNamerFactory.cpp
# Opt level: O2

NamerCreator * ApprovalTests::DefaultNamerFactory::defaultNamer(void)

{
  int iVar1;
  
  if ((defaultNamer()::namer == '\0') &&
     (iVar1 = __cxa_guard_acquire(&defaultNamer()::namer), iVar1 != 0)) {
    defaultNamer::namer.super__Function_base._M_functor = (_Any_data)ZEXT816(0);
    defaultNamer::namer._M_invoker =
         ::std::
         _Function_handler<std::shared_ptr<ApprovalTests::ApprovalNamer>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/namers/DefaultNamerFactory.cpp:8:37)>
         ::_M_invoke;
    defaultNamer::namer.super__Function_base._M_manager =
         ::std::
         _Function_handler<std::shared_ptr<ApprovalTests::ApprovalNamer>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/ApprovalTests/namers/DefaultNamerFactory.cpp:8:37)>
         ::_M_manager;
    __cxa_atexit(Catch::clara::std::_Function_base::~_Function_base,&defaultNamer::namer,
                 &__dso_handle);
    __cxa_guard_release(&defaultNamer()::namer);
  }
  return &defaultNamer::namer;
}

Assistant:

NamerCreator& DefaultNamerFactory::defaultNamer()
    {
        static NamerCreator namer = []() {
            return std::make_shared<ApprovalTestNamer>();
        };
        return namer;
    }